

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5StructureAddLevel(int *pRc,Fts5Structure **ppStruct)

{
  Fts5StructureLevel *pFVar1;
  int iVar2;
  uint uVar3;
  Fts5Structure *__dest;
  void *__dest_00;
  Fts5Structure *pFVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  Fts5StructureSegment **ppFVar8;
  size_t sVar9;
  
  if (*pRc != 0) {
    return;
  }
  pFVar4 = *ppStruct;
  if (1 < pFVar4->nRef) {
    sVar9 = (long)pFVar4->nLevel * 0x10 + 0x20;
    __dest = (Fts5Structure *)sqlite3Fts5MallocZero(pRc,sVar9);
    if (__dest != (Fts5Structure *)0x0) {
      memcpy(__dest,pFVar4,sVar9);
      uVar3 = pFVar4->nLevel;
      lVar5 = 0;
      uVar6 = 0;
      if (0 < (int)uVar3) {
        uVar6 = (ulong)uVar3;
      }
      for (; uVar6 * 0x10 != lVar5; lVar5 = lVar5 + 0x10) {
        *(undefined8 *)((long)&__dest->aLevel[0].aSeg + lVar5) = 0;
      }
      lVar5 = 0x28;
      lVar7 = 0;
LAB_001cb204:
      if (lVar7 < (int)uVar3) {
        sVar9 = (long)*(int *)((long)__dest->aLevel + lVar5 + -0x24) * 0x38;
        __dest_00 = sqlite3Fts5MallocZero(pRc,sVar9);
        *(void **)((long)&((Fts5Structure *)(__dest->aLevel + -2))->nRef + lVar5) = __dest_00;
        if (__dest_00 != (void *)0x0) goto code_r0x001cb228;
        ppFVar8 = &__dest->aLevel[0].aSeg;
        for (lVar5 = 0; lVar5 < pFVar4->nLevel; lVar5 = lVar5 + 1) {
          sqlite3_free(*ppFVar8);
          ppFVar8 = ppFVar8 + 2;
        }
        sqlite3_free(__dest);
        goto LAB_001cb289;
      }
      pFVar4->nRef = pFVar4->nRef + -1;
      __dest->nRef = 1;
    }
    *ppStruct = __dest;
LAB_001cb289:
    if (*pRc != 0) {
      return;
    }
    pFVar4 = *ppStruct;
  }
  iVar2 = pFVar4->nLevel;
  pFVar4 = (Fts5Structure *)sqlite3_realloc64(pFVar4,(long)iVar2 * 0x10 + 0x40);
  if (pFVar4 == (Fts5Structure *)0x0) {
    *pRc = 7;
  }
  else {
    pFVar1 = pFVar4->aLevel + iVar2;
    pFVar1->nMerge = 0;
    pFVar1->nSeg = 0;
    pFVar1->aSeg = (Fts5StructureSegment *)0x0;
    pFVar4->nLevel = pFVar4->nLevel + 1;
    *ppStruct = pFVar4;
  }
  return;
code_r0x001cb228:
  memcpy(__dest_00,*(void **)((long)&((Fts5Structure *)(pFVar4->aLevel + -2))->nRef + lVar5),sVar9);
  lVar7 = lVar7 + 1;
  uVar3 = pFVar4->nLevel;
  lVar5 = lVar5 + 0x10;
  goto LAB_001cb204;
}

Assistant:

static void fts5StructureMakeWritable(int *pRc, Fts5Structure **pp){
  Fts5Structure *p = *pp;
  if( *pRc==SQLITE_OK && p->nRef>1 ){
    i64 nByte = sizeof(Fts5Structure)+(p->nLevel-1)*sizeof(Fts5StructureLevel);
    Fts5Structure *pNew;
    pNew = (Fts5Structure*)sqlite3Fts5MallocZero(pRc, nByte);
    if( pNew ){
      int i;
      memcpy(pNew, p, nByte);
      for(i=0; i<p->nLevel; i++) pNew->aLevel[i].aSeg = 0;
      for(i=0; i<p->nLevel; i++){
        Fts5StructureLevel *pLvl = &pNew->aLevel[i];
        nByte = sizeof(Fts5StructureSegment) * pNew->aLevel[i].nSeg;
        pLvl->aSeg = (Fts5StructureSegment*)sqlite3Fts5MallocZero(pRc, nByte);
        if( pLvl->aSeg==0 ){
          for(i=0; i<p->nLevel; i++){
            sqlite3_free(pNew->aLevel[i].aSeg);
          }
          sqlite3_free(pNew);
          return;
        }
        memcpy(pLvl->aSeg, p->aLevel[i].aSeg, nByte);
      }
      p->nRef--;
      pNew->nRef = 1;
    }
    *pp = pNew;
  }
}